

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

void __thiscall BGParseWorkItem::WaitForCompletion(BGParseWorkItem *this)

{
  bool bVar1;
  DWORD DVar2;
  DWORD DVar3;
  Tick local_18;
  Tick now;
  BGParseWorkItem *this_local;
  
  if (this->complete != (Event *)0x0) {
    now.m_luTick = (uint64)this;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BgParsePhase);
    if (bVar1) {
      local_18 = Js::Tick::Now();
      DVar2 = GetCookie(this);
      DVar3 = GetCurrentThreadId();
      Js::Tick::ToMilliseconds(&local_18);
      Output::Print(L"[BgParse: Wait -- cookie: %04d on thread 0x%X at %.2f ms]\n",(ulong)DVar2,
                    (ulong)DVar3);
    }
    Event::Wait(this->complete,0xffffffff);
  }
  return;
}

Assistant:

void BGParseWorkItem::WaitForCompletion()
{
    if (this->complete != nullptr)
    {
        if (PHASE_TRACE1(Js::BgParsePhase))
        {
            Js::Tick now = Js::Tick::Now();
            Output::Print(
                _u("[BgParse: Wait -- cookie: %04d on thread 0x%X at %.2f ms]\n"),
                GetCookie(),
                ::GetCurrentThreadId(),
                now.ToMilliseconds()
            );
        }

        this->complete->Wait();
    }
}